

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

cmTarget * __thiscall
cmGlobalGenerator::FindTarget(cmGlobalGenerator *this,string *name,bool excludeAliases)

{
  const_iterator cVar1;
  cmTarget *pcVar2;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,excludeAliases) == 0) {
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->AliasTargets)._M_t,name);
    if ((_Rb_tree_header *)cVar1._M_node != &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header
       ) {
      name = (string *)(cVar1._M_node + 2);
    }
  }
  pcVar2 = FindTargetImpl(this,name);
  return pcVar2;
}

Assistant:

cmTarget* cmGlobalGenerator::FindTarget(const std::string& name,
                                        bool excludeAliases) const
{
  if (!excludeAliases) {
    auto const ai = this->AliasTargets.find(name);
    if (ai != this->AliasTargets.end()) {
      return this->FindTargetImpl(ai->second);
    }
  }
  return this->FindTargetImpl(name);
}